

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void NOPN2_EnvelopePrepare(ym3438_t *chip)

{
  uint uVar1;
  Bit8u BVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar5 = chip->eg_rate * '\x02' + chip->eg_ksv;
  uVar1 = chip->cycles;
  bVar3 = 0x3f;
  if (bVar5 < 0x3f) {
    bVar3 = bVar5;
  }
  if ((chip->eg_rate == '\0') || (chip->eg_quotient != 2)) {
LAB_0013dc0c:
    bVar5 = 0;
  }
  else if (bVar5 < 0x30) {
    bVar4 = (bVar3 >> 2) + chip->eg_shift_lock & 0xf;
    bVar5 = bVar3;
    if (bVar4 != 0xe) {
      if (bVar4 != 0xd) {
        if (bVar4 != 0xc) goto LAB_0013dc0c;
        bVar5 = 1;
        goto LAB_0013dc0e;
      }
      bVar5 = bVar3 >> 1;
    }
    bVar5 = bVar5 & 1;
  }
  else {
    bVar4 = ((bVar3 >> 2) +
            (char)*(undefined4 *)
                   ((long)eg_stephi[0] +
                   (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar3 & 3) << 4))) - 0xb;
    bVar5 = 4;
    if (bVar4 < 4) {
      bVar5 = bVar4;
    }
  }
LAB_0013dc0e:
  chip->eg_inc = bVar5;
  chip->eg_ratemax = (~bVar3 & 0x3e) == 0;
  BVar2 = chip->eg_state[uVar1];
  if (chip->eg_kon[uVar1] == '\0') {
LAB_0013dc40:
    if (chip->eg_kon_latch[uVar1] != '\0') {
LAB_0013dc4a:
      BVar2 = '\0';
    }
  }
  else {
    if (chip->eg_ssg_repeat_latch[uVar1] != '\0') goto LAB_0013dc4a;
    if (chip->eg_kon[uVar1] == '\0') goto LAB_0013dc40;
  }
  switch(BVar2) {
  case '\0':
    BVar2 = chip->ar[uVar1];
    break;
  case '\x01':
    BVar2 = chip->dr[uVar1];
    break;
  case '\x02':
    BVar2 = chip->sr[uVar1];
    break;
  case '\x03':
    BVar2 = chip->rr[uVar1] * '\x02' + '\x01';
    break;
  default:
    goto switchD_0013dc62_default;
  }
  chip->eg_rate = BVar2;
switchD_0013dc62_default:
  chip->eg_ksv = chip->pg_kcode >> ((chip->ks[uVar1] ^ 3) & 0x1f);
  if (chip->am[uVar1] == '\0') {
    bVar3 = 0;
  }
  else {
    bVar3 = chip->lfo_am >> ("\a\x03\x01"[chip->ams[chip->channel]] & 0x1f);
  }
  chip->eg_lfo_am = bVar3;
  BVar2 = chip->eg_sl[0];
  chip->eg_tl[1] = chip->eg_tl[0];
  chip->eg_tl[0] = chip->tl[uVar1];
  chip->eg_sl[1] = BVar2;
  chip->eg_sl[0] = chip->sl[uVar1];
  return;
}

Assistant:

void NOPN2_EnvelopePrepare(ym3438_t *chip)
{
    Bit8u rate;
    Bit8u sum;
    Bit8u inc = 0;
    Bit32u slot = chip->cycles;
    Bit8u rate_sel;

    /* Prepare increment */
    rate = (chip->eg_rate << 1) + chip->eg_ksv;

    if (rate > 0x3f)
    {
        rate = 0x3f;
    }

    sum = ((rate >> 2) + chip->eg_shift_lock) & 0x0f;
    if (chip->eg_rate != 0 && chip->eg_quotient == 2)
    {
        if (rate < 48)
        {
            switch (sum)
            {
            case 12:
                inc = 1;
                break;
            case 13:
                inc = (rate >> 1) & 0x01;
                break;
            case 14:
                inc = rate & 0x01;
                break;
            default:
                break;
            }
        }
        else
        {
            inc = eg_stephi[rate & 0x03][chip->eg_timer_low_lock] + (rate >> 2) - 11;
            if (inc > 4)
            {
                inc = 4;
            }
        }
    }
    chip->eg_inc = inc;
    chip->eg_ratemax = (rate >> 1) == 0x1f;

    /* Prepare rate & ksv */
    rate_sel = chip->eg_state[slot];
    if ((chip->eg_kon[slot] && chip->eg_ssg_repeat_latch[slot])
     || (!chip->eg_kon[slot] && chip->eg_kon_latch[slot]))
    {
        rate_sel = eg_num_attack;
    }
    switch (rate_sel)
    {
    case eg_num_attack:
        chip->eg_rate = chip->ar[slot];
        break;
    case eg_num_decay:
        chip->eg_rate = chip->dr[slot];
        break;
    case eg_num_sustain:
        chip->eg_rate = chip->sr[slot];
        break;
    case eg_num_release:
        chip->eg_rate = (chip->rr[slot] << 1) | 0x01;
        break;
    default:
        break;
    }
    chip->eg_ksv = chip->pg_kcode >> (chip->ks[slot] ^ 0x03);
    if (chip->am[slot])
    {
        chip->eg_lfo_am = chip->lfo_am >> eg_am_shift[chip->ams[chip->channel]];
    }
    else
    {
        chip->eg_lfo_am = 0;
    }
    /* Delay TL & SL value */
    chip->eg_tl[1] = chip->eg_tl[0];
    chip->eg_tl[0] = chip->tl[slot];
    chip->eg_sl[1] = chip->eg_sl[0];
    chip->eg_sl[0] = chip->sl[slot];
}